

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O3

QByteArray * __thiscall
QItemEditorFactory::valuePropertyName
          (QByteArray *__return_storage_ptr__,QItemEditorFactory *this,int userType)

{
  Data<QHashPrivate::Node<int,_QItemEditorCreatorBase_*>_> *this_00;
  Node<int,_QItemEditorCreatorBase_*> *pNVar1;
  QItemEditorFactory *pQVar2;
  long in_FS_OFFSET;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->creatorMap).d;
  local_1c = userType;
  if (this_00 != (Data<QHashPrivate::Node<int,_QItemEditorCreatorBase_*>_> *)0x0) {
    pNVar1 = QHashPrivate::Data<QHashPrivate::Node<int,_QItemEditorCreatorBase_*>_>::findNode<int>
                       (this_00,(int *)&local_1c);
    if ((pNVar1 != (Node<int,_QItemEditorCreatorBase_*> *)0x0) &&
       (pNVar1->value != (QItemEditorCreatorBase *)0x0)) {
      (*pNVar1->value->_vptr_QItemEditorCreatorBase[3])(__return_storage_ptr__);
      goto LAB_0055b227;
    }
  }
  pQVar2 = defaultFactory();
  if (pQVar2 == this) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (*pQVar2->_vptr_QItemEditorFactory[3])(__return_storage_ptr__,pQVar2,(ulong)local_1c);
  }
LAB_0055b227:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QItemEditorFactory::valuePropertyName(int userType) const
{
    QItemEditorCreatorBase *creator = creatorMap.value(userType, 0);
    if (!creator) {
        const QItemEditorFactory *dfactory = defaultFactory();
        return dfactory == this ? QByteArray() : dfactory->valuePropertyName(userType);
    }
    return creator->valuePropertyName();
}